

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O1

void __thiscall AllReduceSync::waitForSynchronization(AllReduceSync *this)

{
  bool bVar1;
  unique_lock *puVar2;
  uint uVar3;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = this->m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  uVar3 = this->m_count + 1;
  this->m_count = uVar3;
  if ((ulong)uVar3 < this->m_total) {
    bVar1 = this->m_run;
    puVar2 = (unique_lock *)this->m_cv;
    do {
      std::condition_variable::wait(puVar2);
    } while (this->m_run == bVar1);
  }
  else {
    std::condition_variable::notify_all();
    this->m_count = 0;
    this->m_run = (bool)(this->m_run ^ 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void AllReduceSync::waitForSynchronization()
{
  unique_lock<mutex> l(*m_mutex);
  m_count++;

  if (m_count >= m_total)
  {
    assert(m_count == m_total);

    m_cv->notify_all();

    // order of m_count before or after notify_all doesn't matter
    // since the lock is still hold at this point in time.
    m_count = 0;

    // flip for the next run
    m_run = !m_run;
  }
  else
  {
    bool current_run = m_run;
    // this predicate cannot depend on m_count, as somebody can race ahead and m_count++
    // FYI just wait can spuriously wake-up
    m_cv->wait(l, [this, current_run] { return m_run != current_run; });
  }
}